

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Track.cpp
# Opt level: O2

int __thiscall Track::data_extent_bits(Track *this,Sector *sector)

{
  int iVar1;
  const_iterator cVar2;
  Sector *pSVar3;
  
  cVar2 = find(this,sector);
  pSVar3 = (this->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (cVar2._M_current != pSVar3) {
    iVar1 = this->tracklen;
    if (iVar1 == 0) {
      iVar1 = 200000;
      if (sector->datarate == _300K) {
        iVar1 = 0x28b0b;
      }
      iVar1 = GetTrackCapacity(iVar1,sector->datarate,sector->encoding);
      pSVar3 = (this->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    if (cVar2._M_current + 1 == pSVar3) {
      iVar1 = iVar1 + ((this->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl
                       .super__Vector_impl_data._M_start)->offset;
    }
    else {
      iVar1 = cVar2._M_current[1].offset;
    }
    return iVar1 - sector->offset;
  }
  __assert_fail("it != end()",
                "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/Track.cpp"
                ,0x4a,"int Track::data_extent_bits(const Sector &) const");
}

Assistant:

int Track::data_extent_bits(const Sector& sector) const
{
    auto it = find(sector);
    assert(it != end());

    auto drive_speed = (sector.datarate == DataRate::_300K) ? RPM_TIME_360 : RPM_TIME_300;
    auto track_len = tracklen ? tracklen : GetTrackCapacity(drive_speed, sector.datarate, sector.encoding);

    // Approximate bit distance to next ID header.
    auto gap_bits = ((std::next(it) != end()) ? std::next(it)->offset : (track_len + begin()->offset)) - sector.offset;
    return gap_bits;
}